

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O2

int oonf_cfg_rollback(void)

{
  cfg_db *db;
  cfg_db *src;
  int iVar1;
  cfg_db *dst;
  
  db = _oonf_raw_db;
  if ((log_global_mask[3] & 2) != 0) {
    oonf_log(LOG_SEVERITY_INFO,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x1b7,(void *)0x0,0,
             "Rollback configuration");
  }
  src = _oonf_work_db;
  dst = cfg_db_add();
  if (dst != (cfg_db *)0x0) {
    iVar1 = _cfg_db_append(dst,src,(char *)0x0,(char *)0x0,(char *)0x0);
    if (iVar1 == 0) {
      _oonf_raw_db = dst;
      cfg_db_remove(db);
      return 0;
    }
    cfg_db_remove(dst);
  }
  _oonf_raw_db = (cfg_db *)0x0;
  if ((log_global_mask[3] & 4) != 0) {
    oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x1bb,(void *)0x0,0,
             "Cannot create raw configuration database.");
  }
  _oonf_raw_db = db;
  return -1;
}

Assistant:

int
oonf_cfg_rollback(void) {
  struct cfg_db *db;

  /* remember old db */
  db = _oonf_raw_db;

  OONF_INFO(LOG_CONFIG, "Rollback configuration");

  _oonf_raw_db = cfg_db_duplicate(_oonf_work_db);
  if (_oonf_raw_db == NULL) {
    OONF_WARN(LOG_CONFIG, "Cannot create raw configuration database.");
    _oonf_raw_db = db;
    return -1;
  }

  /* free old db */
  cfg_db_remove(db);
  return 0;
}